

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch2.h
# Opt level: O1

bool hashSearch2<std::__cxx11::string>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *keys,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *vals,string *hash_str,string *map_name,string *default_value,
               uint8_t expansion,uint8_t reduction,bool nonKeyLookups)

{
  pointer pcVar1;
  pointer pbVar2;
  string map_name_00;
  pointer pBVar3;
  pointer pBVar4;
  bool bVar5;
  bool bVar6;
  ushort uVar7;
  SeedType SVar8;
  uint uVar9;
  size_t n1;
  size_t n2;
  undefined4 *puVar10;
  size_type sVar11;
  __normal_iterator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __i;
  long lVar12;
  pointer pBVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  ulong uVar14;
  pointer __x;
  Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *bin;
  long lVar15;
  bool bVar16;
  bool bVar17;
  undefined8 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 uVar18;
  undefined2 in_stack_fffffffffffffee6;
  vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  layer1;
  vector<bool,_std::allocator<bool>_> final_layer;
  long *local_c0;
  long local_b8;
  long local_b0 [2];
  long *local_a0 [2];
  long local_90 [2];
  string *local_80;
  string *local_78;
  size_type local_70;
  size_type local_68;
  string *local_60;
  ulong local_58;
  Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_50;
  vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  lVar15 = (long)(keys->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(keys->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  uVar14 = lVar15 >> 5;
  local_80 = hash_str;
  local_78 = default_value;
  local_60 = map_name;
  if (uVar14 < 2) {
    __assert_fail("keys.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch2.h"
                  ,0xdc,
                  "bool hashSearch2(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = std::basic_string<char>]"
                 );
  }
  bVar5 = hasDuplicates<std::__cxx11::string>(keys);
  if (bVar5) {
    __assert_fail("!hasDuplicates(keys)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch2.h"
                  ,0xdd,
                  "bool hashSearch2(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = std::basic_string<char>]"
                 );
  }
  if ((long)(vals->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(vals->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start != lVar15) {
    __assert_fail("vals.size() == keys.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch2.h"
                  ,0xde,
                  "bool hashSearch2(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = std::basic_string<char>]"
                 );
  }
  n1 = getModulusBitmask((uVar14 * expansion) / (ulong)reduction);
  n2 = getModulusBitmask((long)(keys->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(keys->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 5);
  local_68 = n1 + 1;
  bVar5 = local_68 == 0;
  local_70 = n2 + 1;
  uVar18 = CONCAT13(1,(int3)in_stack_fffffffffffffee0);
  local_58 = 0;
  do {
    uVar7 = (ushort)(byte)(&DAT_001178e0)[local_58];
    local_c0 = local_b0;
    pcVar1 = (local_60->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar1,pcVar1 + local_60->_M_string_length);
    std::
    vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&layer1,local_68,(allocator_type *)&final_layer);
    puVar10 = (undefined4 *)
              CONCAT71(layer1.
                       super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                       layer1.
                       super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_1_);
    lVar15 = 0;
    do {
      *puVar10 = (int)lVar15;
      lVar15 = lVar15 + 1;
      puVar10 = puVar10 + 8;
    } while (n1 + 1 + (ulong)bVar5 != lVar15);
    pbVar2 = (keys->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (__x = (keys->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
        pBVar4 = layer1.
                 super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish, __x != pbVar2; __x = __x + 1) {
      if (__x->_M_string_length == 0) {
        uVar9 = 0;
      }
      else {
        sVar11 = 0;
        uVar9 = 0;
        do {
          uVar9 = uVar9 * uVar7 + (int)(__x->_M_dataplus)._M_p[sVar11];
          sVar11 = sVar11 + 1;
        } while (__x->_M_string_length != sVar11);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(CONCAT71(layer1.
                               super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               layer1.
                               super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                      (ulong)(uVar9 & (uint)n1) * 0x20 + 8),__x);
    }
    pBVar3 = (pointer)CONCAT71(layer1.
                               super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               layer1.
                               super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if (pBVar3 != layer1.
                  super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      lVar12 = (long)layer1.
                     super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar3;
      uVar14 = lVar12 >> 5;
      lVar15 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Bin<std::__cxx11::string>*,std::vector<Bin<std::__cxx11::string>,std::allocator<Bin<std::__cxx11::string>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<testSeed<std::__cxx11::string>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>>
                (pBVar3,layer1.
                        super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e)
      ;
      if (lVar12 < 0x201) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Bin<std::__cxx11::string>*,std::vector<Bin<std::__cxx11::string>,std::allocator<Bin<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<testSeed<std::__cxx11::string>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>>
                  (pBVar3,pBVar4);
      }
      else {
        pBVar13 = pBVar3 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Bin<std::__cxx11::string>*,std::vector<Bin<std::__cxx11::string>,std::allocator<Bin<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<testSeed<std::__cxx11::string>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>>
                  (pBVar3,pBVar13);
        for (; pBVar13 != pBVar4; pBVar13 = pBVar13 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Bin<std::__cxx11::string>*,std::vector<Bin<std::__cxx11::string>,std::allocator<Bin<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Val_comp_iter<testSeed<std::__cxx11::string>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>>
                    (pBVar13);
        }
      }
    }
    uVar14 = *(long *)(CONCAT71(layer1.
                                super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                layer1.
                                super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_1_) + 0x10) -
             *(long *)(CONCAT71(layer1.
                                super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                layer1.
                                super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8);
    bVar16 = true;
    if (uVar14 != 0x20) {
      if (uVar14 < 0x121) {
        local_48.
        super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
        std::vector<bool,_std::allocator<bool>_>::vector
                  (&final_layer,local_70,(bool *)&local_48,
                   (allocator_type *)&stack0xfffffffffffffee7);
        bin = (Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT71(layer1.
                          super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._1_7_,
                          layer1.
                          super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._0_1_);
        local_50 = layer1.
                   super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        bVar16 = bin == layer1.
                        super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
        while (!bVar16) {
          bin->seed = 0;
          bVar17 = true;
          do {
            bVar6 = testSeed<std::__cxx11::string>(bin,n2,&final_layer);
            if (bVar6) break;
            SVar8 = (short)*(undefined4 *)&bin->seed + 1;
            bin->seed = SVar8;
            bVar17 = SVar8 != 0xffff;
          } while (bVar17);
          if (!bVar17) goto LAB_0010d08d;
          bin = bin + 1;
          bVar16 = bin == local_50;
        }
        std::
        vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector(&local_48,&layer1);
        local_a0[0] = local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a0,local_c0,local_b8 + (long)local_c0);
        map_name_00._M_string_length = (size_type)local_78;
        map_name_00._M_dataplus._M_p = (pointer)local_a0;
        map_name_00.field_2._M_local_buf[0] = nonKeyLookups;
        map_name_00.field_2._M_allocated_capacity._1_7_ = 0;
        map_name_00.field_2._8_8_ = in_stack_fffffffffffffed8;
        writeHash2<std::__cxx11::string>
                  (keys,(SeedType *)&stack0xfffffffffffffee4,n1,n2,vals,&local_48,local_80,
                   map_name_00,(string *)CONCAT26(in_stack_fffffffffffffee6,CONCAT24(uVar7,uVar18)),
                   (bool)layer1.
                         super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_);
        if (local_a0[0] != local_90) {
          operator_delete(local_a0[0],local_90[0] + 1);
        }
        std::
        vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_48);
LAB_0010d08d:
        if (final_layer.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(final_layer.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)final_layer.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage -
                          (long)final_layer.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          final_layer.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          final_layer.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          final_layer.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          final_layer.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0;
          final_layer.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = (_Bit_pointer)0x0;
        }
      }
      else {
        bVar16 = false;
      }
    }
    std::
    vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&layer1);
    if (local_c0 != local_b0) {
      operator_delete(local_c0,local_b0[0] + 1);
    }
    if (bVar16) break;
    bVar16 = local_58 < 0x1f;
    local_58 = local_58 + 1;
    uVar18 = CONCAT13(bVar16,(int3)uVar18);
  } while (local_58 != 0x20);
  return (bool)((byte)((uint)uVar18 >> 0x18) & 1);
}

Assistant:

bool hashSearch2(const std::vector<KeyType>& keys,
                 const std::vector<std::string>& vals,
                 std::string& hash_str,
                 std::string map_name = "PoifectMap",
                 std::string default_value = "",
                 uint8_t expansion = 1,
                 uint8_t reduction = 1,
                 bool nonKeyLookups = true){
    assert(keys.size() > 1);
    assert(!hasDuplicates(keys));
    assert(vals.size() == keys.size());

    const size_t n1 = getModulusBitmask(keys.size()*expansion/reduction);
    const size_t n2 = getModulusBitmask(keys.size());

    const uint8_t primes[32] = {  0,   1,   2,   3,   5,
                                  7,  11,  13,  17,  19,
                                 23,  29,  31,  37,  41,
                                 43,  47,  53,  59,  61,
                                 67,  71,  73,  79,  83,
                                 89,  97, 101, 103, 107,
                                109, 113};

    for(SeedType seed = 0; seed < 32; seed++)
        if(testSeed<KeyType>(keys, primes[seed], n1, n2, vals, hash_str, map_name, default_value, nonKeyLookups))
            return true;

    return false;
}